

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O3

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    *fmt)

{
  int *piVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  piVar1 = (fmt->begin)._M_current;
  if ((fmt->end)._M_current != piVar1) {
    do {
      if (piVar1 != (fmt->begin)._M_current) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      std::ostream::operator<<(str,*piVar1);
      piVar1 = piVar1 + 1;
    } while (piVar1 != (fmt->end)._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}